

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

return_of_t<void_()> __thiscall
trompeloeil::mock_func<false,void()>
          (trompeloeil *this,char *param_2,undefined8 param_3,undefined8 param_4,
          call_params_type_t<void_()> *param_5)

{
  call_matcher_base<void_()> *pcVar1;
  long *plVar2;
  long *plVar3;
  call_params_type_t<void_()> param_value;
  unique_lock<std::recursive_mutex> lock;
  trace_agent ta;
  undefined1 local_201 [17];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  trace_agent local_1b0;
  
  get_lock<void>();
  local_201[0] = (call_params_type_t<void_()>)0x0;
  pcVar1 = find<void()>((call_matcher_list<void_()> *)this,(call_params_type_t<void_()> *)local_201)
  ;
  if (pcVar1 != (call_matcher_base<void_()> *)0x0) {
    report_match<void()>((call_matcher_list<void_()> *)this);
    trace_agent::trace_agent(&local_1b0,pcVar1->loc,pcVar1->name,tracer_obj()::ptr);
    (*(pcVar1->super_list_elem<trompeloeil::call_matcher_base<void_()>_>)._vptr_list_elem[5])
              (pcVar1,local_201,this + 0x18);
    (*(pcVar1->super_list_elem<trompeloeil::call_matcher_base<void_()>_>)._vptr_list_elem[8])
              (pcVar1,&local_1b0,local_201);
    trace_agent::~trace_agent(&local_1b0);
    Catch::clara::std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)(local_201 + 1));
    return;
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0," with signature ","");
  std::operator+(&local_1d0,param_2,&local_1f0);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  local_1b0.loc.file = (char *)*plVar2;
  plVar3 = plVar2 + 2;
  if ((long *)local_1b0.loc.file == plVar3) {
    local_1b0.t = (tracer *)*plVar3;
    local_1b0._24_8_ = plVar2[3];
    local_1b0.loc.file = (char *)&local_1b0.t;
  }
  else {
    local_1b0.t = (tracer *)*plVar3;
  }
  local_1b0.loc.line = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  report_mismatch<void()>
            (this,(call_matcher_list<void_()> *)(this + 0x18),
             (call_matcher_list<void_()> *)&local_1b0,(string *)local_201,param_5);
}

Assistant:

return_of_t<Sig>
  mock_func(std::true_type,
            expectations<movable, Sig>& e,
            char const *func_name,
            char const *sig_name,
            P&& ... p)
  {
    auto lock = get_lock();

    call_params_type_t<void(P...)> param_value(std::forward<P>(p)...);

    auto i = find(e.active, param_value);
    if (!i)
    {
      report_mismatch(e.active,
                      e.saturated,
                      func_name + std::string(" with signature ") + sig_name,
                      param_value);
    }
    else{
        report_match(e.active);
    }
    trace_agent ta{i->loc, i->name, tracer_obj()};
    try
    {
      ta.trace_params(param_value);
      i->run_actions(param_value, e.saturated);
      return i->return_value(ta, param_value);
    }
    catch (...)
    {
      ta.trace_exception();
      throw;
    }
  }